

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::ToValueString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region,
          uint8_t *binary,OutputConfig *output_config)

{
  bool bVar1;
  int iVar2;
  byte local_119;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined4 local_68;
  byte local_51;
  ulong uStack_50;
  uint8_t c;
  uint64_t i;
  string s;
  OutputConfig *output_config_local;
  uint8_t *binary_local;
  BinaryRegion *region_local;
  
  s.field_2._8_8_ = binary;
  std::__cxx11::string::string((string *)&i);
  if (*(long *)(this + 0x18) != 0) {
    if ((*(int *)(this + 0x10) == 7) || (*(int *)(this + 0x10) == 0)) {
      for (uStack_50 = 0; uStack_50 < *(ulong *)(this + 0x18); uStack_50 = uStack_50 + 1) {
        local_51 = *(byte *)((long)&region->offset + uStack_50 + *(long *)this);
        iVar2 = isprint((uint)local_51);
        if (iVar2 == 0) {
          local_119 = 0x2e;
        }
        else {
          local_119 = local_51 & 0x7f;
        }
        std::__cxx11::string::operator+=((string *)&i,local_119);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&i);
      goto LAB_003b7c14;
    }
    if (*(int *)(this + 0x10) == 6) {
      ToValueString<std::__cxx11::string>(__return_storage_ptr__,this,region,binary);
      goto LAB_003b7c14;
    }
  }
  switch(*(undefined4 *)(this + 0x10)) {
  case 1:
    anon_unknown_7::ToValueString<unsigned_int>(&local_a8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::operator+=((string *)&i,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  default:
switchD_003b786f_default:
    bVar1 = anon_unknown_7::IsOffset(*(BinaryRegionType *)(this + 0x10));
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)&i," Loc: 0x");
      ToHex<unsigned_long>
                (&local_108,*(unsigned_long *)(this + 0x20),*(size_t *)(s.field_2._8_8_ + 0x18));
      std::__cxx11::string::operator+=((string *)&i,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&i);
    break;
  case 2:
    anon_unknown_7::ToValueString<int>(&local_c8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::operator+=((string *)&i,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    goto switchD_003b786f_default;
  case 3:
    anon_unknown_7::ToValueString<unsigned_short>(&local_e8,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::operator+=((string *)&i,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    goto switchD_003b786f_default;
  case 4:
    anon_unknown_7::ToValueString<bool>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 5:
  case 8:
    anon_unknown_7::ToValueString<signed_char>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 6:
    anon_unknown_7::ToValueString<char>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 7:
    anon_unknown_7::ToValueString<unsigned_char>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 9:
    anon_unknown_7::ToValueString<unsigned_short>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 10:
    anon_unknown_7::ToValueString<short>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xb:
    anon_unknown_7::ToValueString<unsigned_int>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xc:
    anon_unknown_7::ToValueString<int>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xd:
    anon_unknown_7::ToValueString<unsigned_long>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xe:
    anon_unknown_7::ToValueString<long>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xf:
    anon_unknown_7::ToValueString<float>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0x10:
    anon_unknown_7::ToValueString<double>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0x11:
    anon_unknown_7::ToValueString<unsigned_char>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0x12:
    anon_unknown_7::ToValueString<unsigned_long>(&local_88,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::operator+=((string *)&i,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    goto switchD_003b786f_default;
  }
LAB_003b7c14:
  local_68 = 1;
  std::__cxx11::string::~string((string *)&i);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToValueString(const BinaryRegion &region,
                                 const uint8_t *binary,
                                 const OutputConfig &output_config) {
  std::string s;

  if (region.array_length) {
    if (region.type == BinaryRegionType::Uint8 ||
        region.type == BinaryRegionType::Unknown) {
      // Interpret each value as a ASCII to aid debugging
      for (uint64_t i = 0; i < region.array_length; ++i) {
        const uint8_t c = *(binary + region.offset + i);
        s += isprint(c) ? static_cast<char>(c & 0x7F) : '.';
      }
      return s;
    } else if (region.type == BinaryRegionType::Char) {
      // string value
      return ToValueString<std::string>(region, binary);
    }
  }

  switch (region.type) {
    case BinaryRegionType::Uint32:
      return ToValueString<uint32_t>(region, binary);
    case BinaryRegionType::Int32: return ToValueString<int32_t>(region, binary);
    case BinaryRegionType::Uint16:
      return ToValueString<uint16_t>(region, binary);
    case BinaryRegionType::Int16: return ToValueString<int16_t>(region, binary);
    case BinaryRegionType::Bool: return ToValueString<bool>(region, binary);
    case BinaryRegionType::Uint8: return ToValueString<uint8_t>(region, binary);
    case BinaryRegionType::Char: return ToValueString<char>(region, binary);
    case BinaryRegionType::Byte:
    case BinaryRegionType::Int8: return ToValueString<int8_t>(region, binary);
    case BinaryRegionType::Int64: return ToValueString<int64_t>(region, binary);
    case BinaryRegionType::Uint64:
      return ToValueString<uint64_t>(region, binary);
    case BinaryRegionType::Double: return ToValueString<double>(region, binary);
    case BinaryRegionType::Float: return ToValueString<float>(region, binary);
    case BinaryRegionType::UType: return ToValueString<uint8_t>(region, binary);

    // Handle Offsets separately, incase they add additional details.
    case BinaryRegionType::UOffset64:
      s += ToValueString<uint64_t>(region, binary);
      break;
    case BinaryRegionType::UOffset:
      s += ToValueString<uint32_t>(region, binary);
      break;
    case BinaryRegionType::SOffset:
      s += ToValueString<int32_t>(region, binary);
      break;
    case BinaryRegionType::VOffset:
      s += ToValueString<uint16_t>(region, binary);
      break;

    default: break;
  }
  // If this is an offset type, include the calculated offset location in the
  // value.
  // TODO(dbaileychess): It might be nicer to put this in the comment field.
  if (IsOffset(region.type)) {
    s += " Loc: 0x";
    s += ToHex(region.points_to_offset, output_config.offset_max_char);
  }
  return s;
}